

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure_test.cc
# Opt level: O2

void __thiscall
xLearn::DMATRIX_TEST_Find_Max_Feat_and_Field_Test::TestBody
          (DMATRIX_TEST_Find_Max_Feat_and_Field_Test *this)

{
  index_t row_id;
  size_t i;
  long lVar1;
  char *pcVar2;
  AssertHelper local_98;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  AssertionResult gtest_ar;
  DMatrix matrix;
  
  DMatrix::DMatrix(&matrix);
  DMatrix::Reset(&matrix);
  for (lVar1 = 0; lVar1 != 10; lVar1 = lVar1 + 1) {
    DMatrix::AddRow(&matrix);
    row_id = (index_t)lVar1;
    DMatrix::AddNode(&matrix,row_id,row_id,2.5,row_id);
    matrix.Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar1] = (float)lVar1;
    matrix.norm.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar1] = 0.25;
  }
  matrix.hash_value_1 = 0x4d2;
  matrix.hash_value_2 = 0x162e;
  local_90.ptr_._0_4_ = DMatrix::MaxFeat(&matrix);
  local_98.data_._0_4_ = 9;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"matrix.MaxFeat()","9",(uint *)&local_90,(int *)&local_98);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x90,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_90.ptr_._0_4_ = DMatrix::MaxField(&matrix);
  local_98.data_._0_4_ = 9;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"matrix.MaxField()","9",(uint *)&local_90,(int *)&local_98);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x91,pcVar2);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  DMatrix::~DMatrix(&matrix);
  return;
}

Assistant:

TEST(DMATRIX_TEST, Find_Max_Feat_and_Field) {
  DMatrix matrix;
  matrix.Reset();
  for (size_t i = 0; i < kLength; ++i) {
    matrix.AddRow();
    matrix.AddNode(i, i, 2.5, i);
    matrix.Y[i] = i;
    matrix.norm[i] = 0.25;
  }
  matrix.SetHash(1234, 5678);
  EXPECT_EQ(matrix.MaxFeat(), 9);
  EXPECT_EQ(matrix.MaxField(), 9);
}